

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicWriter<wchar_t>::write_int<bool,fmt::FormatSpec>
          (BasicWriter<wchar_t> *this,bool value,FormatSpec spec)

{
  undefined4 uVar1;
  CharPtr pwVar2;
  char *pcVar3;
  char *unaff_RBX;
  uint prefix_size;
  undefined7 in_register_00000031;
  bool bVar4;
  char prefix [4];
  char local_24 [3];
  
  uVar1 = spec._20_4_;
  bVar4 = ((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0;
  prefix_size = (uint)bVar4;
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_00495bc3;
      if (spec.type_ != 'B') goto code_r0x00495c02;
    }
    else {
      if (spec.type_ == 'X') {
LAB_00495b60:
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          local_24[bVar4] = '0';
          prefix_size = prefix_size | 2;
          local_24[(ulong)bVar4 + 1] = spec.type_;
        }
        pwVar2 = prepare_int_buffer<fmt::FormatSpec>(this,1,&spec,local_24,prefix_size);
        pcVar3 = "0123456789ABCDEF";
        if (spec.type_ == 'x') {
          pcVar3 = "0123456789abcdef";
        }
        *pwVar2 = (int)pcVar3[value];
        return;
      }
      if (spec.type_ != 'b') goto code_r0x00495c02;
    }
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      local_24[bVar4] = '0';
      prefix_size = prefix_size | 2;
      local_24[(ulong)bVar4 + 1] = spec.type_;
    }
  }
  else if ((byte)spec.type_ < 0x6f) {
    if (spec.type_ != 'd') {
      if (spec.type_ != 'n') goto code_r0x00495c02;
      localeconv();
      uVar1 = spec._20_4_;
    }
  }
  else {
    if (spec.type_ != 'o') {
      if (spec.type_ == 'x') goto LAB_00495b60;
code_r0x00495c02:
      internal::report_unknown_type('\0',unaff_RBX);
    }
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      prefix_size = prefix_size + 1;
      local_24[bVar4] = '0';
    }
  }
LAB_00495bc3:
  spec._20_4_ = uVar1;
  pwVar2 = prepare_int_buffer<fmt::FormatSpec>(this,1,&spec,local_24,prefix_size);
  *pwVar2 = (uint)CONCAT71(in_register_00000031,value) | 0x30;
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}